

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

sqlite3rbu * openRbuHandle(char *zTarget,char *zRbu,char *zState)

{
  char **pzErrMsg;
  RbuObjIter *pIter_00;
  sqlite3 *db;
  sqlite3 *db_00;
  sqlite3_stmt *psVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  sqlite3rbu *p;
  sqlite3_vfs *psVar6;
  char *pcVar7;
  RbuState *pState;
  sqlite3_int64 sVar8;
  rbu_file **pprVar9;
  char *z2;
  RbuObjIter *pIter;
  sqlite3rbu *__dest;
  bool bVar10;
  int rnd;
  int bRetry;
  
  if (zTarget == (char *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = strlen(zTarget);
  }
  sVar5 = strlen(zRbu);
  p = (sqlite3rbu *)sqlite3_malloc64(sVar5 + sVar4 + 0x172);
  if (p == (sqlite3rbu *)0x0) {
    return (sqlite3rbu *)0x0;
  }
  memset(p,0,0x170);
  sqlite3_randomness(4,&rnd);
  sqlite3_snprintf(0x40,(char *)&bRetry,"rbu_vfs_%d");
  iVar2 = sqlite3rbu_create_vfs((char *)&bRetry,(char *)0x0);
  p->rc = iVar2;
  if (iVar2 == 0) {
    psVar6 = sqlite3_vfs_find((char *)&bRetry);
    p->zVfsName = psVar6->zName;
    psVar6[1].pNext = (sqlite3_vfs *)p;
  }
  if (p->rc == 0) {
    __dest = p + 1;
    _bRetry = (sqlite3_stmt *)((ulong)_bRetry & 0xffffffff00000000);
    if (zTarget != (char *)0x0) {
      p->zTarget = (char *)__dest;
      memcpy(__dest,zTarget,sVar4 + 1);
      __dest = (sqlite3rbu *)(__dest->zStateDb + (sVar4 - 0x2f));
    }
    p->zRbu = (char *)__dest;
    memcpy(__dest,zRbu,sVar5 + 1);
    if (zState != (char *)0x0) {
      pcVar7 = rbuMPrintf(p,"%s");
      p->zState = pcVar7;
    }
    rbuOpenDatabase(p,&bRetry);
    if (bRetry != 0) {
      rbuOpenDatabase(p,(int *)0x0);
    }
    if (p->rc == 0) {
      pState = rbuLoadState(p);
      if (p->rc == 0) {
        iVar2 = pState->eStage;
        if (iVar2 == 0) {
          pcVar7 = rbuMPrintf(p,"%s-oal",p->zTarget);
          if (pcVar7 != (char *)0x0) {
            psVar6 = sqlite3_vfs_find((char *)0x0);
            (*psVar6->xDelete)(psVar6,pcVar7,0);
            sqlite3_free(pcVar7);
          }
          if (p->rc == 0) {
            _bRetry = (sqlite3_stmt *)0x0;
            p->nPhaseOneStep = -1;
            iVar2 = sqlite3_create_function
                              (p->dbRbu,"rbu_index_cnt",1,1,p,rbuIndexCntFunc,
                               (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                               (_func_void_sqlite3_context_ptr *)0x0);
            p->rc = iVar2;
            if (iVar2 == 0) {
              iVar2 = prepareAndCollectError
                                (p->dbRbu,(sqlite3_stmt **)&bRetry,&p->zErrmsg,
                                 "SELECT 1 FROM sqlite_master WHERE tbl_name = \'rbu_count\'");
              psVar1 = _bRetry;
              p->rc = iVar2;
              if (iVar2 == 0) {
                iVar3 = sqlite3_step(_bRetry);
                iVar2 = sqlite3_finalize(psVar1);
                p->rc = iVar2;
                if (iVar3 == 100 && iVar2 == 0) {
                  iVar2 = prepareAndCollectError
                                    (p->dbRbu,(sqlite3_stmt **)&bRetry,&p->zErrmsg,
                                     "SELECT sum(cnt * (1 + rbu_index_cnt(rbu_target_name(tbl))))FROM rbu_count"
                                    );
                  psVar1 = _bRetry;
                  p->rc = iVar2;
                  if (iVar2 == 0) {
                    iVar2 = sqlite3_step(_bRetry);
                    if (iVar2 == 100) {
                      sVar8 = sqlite3_column_int64(psVar1,0);
                      p->nPhaseOneStep = sVar8;
                    }
                    iVar2 = sqlite3_finalize(psVar1);
                    p->rc = iVar2;
                  }
                }
              }
            }
            bVar10 = iVar2 == 0;
          }
          else {
            bVar10 = false;
          }
          p->eStage = 1;
          iVar2 = 1;
        }
        else {
          p->eStage = iVar2;
          p->nPhaseOneStep = pState->nPhaseOneStep;
          bVar10 = true;
        }
        p->nProgress = (int)pState->nProgress;
        p->iOalSz = pState->iOalSz;
        if (bVar10) {
          if (p->pTargetFd->pWalFd != (rbu_file *)0x0) {
            if (iVar2 == 1) {
              p->rc = 1;
              pcVar7 = sqlite3_mprintf("cannot update wal mode database");
              p->zErrmsg = pcVar7;
              if (p->rc != 0) goto switchD_0012c27c_caseD_2;
            }
            else if (iVar2 == 2) {
              p->eStage = 4;
              p->nStep = 0;
            }
          }
          iVar2 = p->eStage;
          if (iVar2 - 1U < 2) {
            if (pState->eStage != 0) {
              pprVar9 = &p->pTargetFd;
              if (p->zTarget == (char *)0x0) {
                pprVar9 = &p->pRbuFd;
              }
              if ((*pprVar9)->iCookie != pState->iCookie) {
                p->rc = 5;
                pcVar7 = "update";
                if (p->zTarget == (char *)0x0) {
                  pcVar7 = "vacuum";
                }
                pcVar7 = sqlite3_mprintf("database modified during rbu %s",pcVar7);
                p->zErrmsg = pcVar7;
                if (p->rc != 0) goto switchD_0012c27c_caseD_2;
              }
            }
            iVar2 = p->eStage;
          }
          switch(iVar2) {
          case 1:
            db = p->dbMain;
            pzErrMsg = &p->zErrmsg;
            iVar2 = sqlite3_exec(p->dbRbu,"BEGIN",(sqlite3_callback)0x0,(void *)0x0,pzErrMsg);
            p->rc = iVar2;
            if (iVar2 == 0) {
              pIter_00 = &p->objiter;
              memset(pIter_00,0,0xa8);
              db_00 = p->dbRbu;
              pcVar7 = "";
              if (p->zTarget == (char *)0x0) {
                pcVar7 = "AND rootpage!=0 AND rootpage IS NOT NULL";
              }
              pcVar7 = sqlite3_mprintf("SELECT rbu_target_name(name, type=\'view\') AS target, name FROM sqlite_master WHERE type IN (\'table\', \'view\') AND target IS NOT NULL  %s ORDER BY name"
                                       ,pcVar7);
              iVar2 = prepareFreeAndCollectError(db_00,&pIter_00->pTblIter,pzErrMsg,pcVar7);
              if (iVar2 == 0) {
                iVar2 = prepareAndCollectError
                                  (p->dbMain,&(p->objiter).pIdxIter,pzErrMsg,
                                   "SELECT name, rootpage, sql IS NULL OR substr(8, 6)==\'UNIQUE\'   FROM main.sqlite_master   WHERE type=\'index\' AND tbl_name = ?"
                                  );
              }
              (p->objiter).bCleanup = 1;
              p->rc = iVar2;
              iVar2 = rbuObjIterNext(p,pIter_00);
              p->rc = iVar2;
              if (iVar2 == 0) {
                if ((p->objiter).zTbl == (char *)0x0) {
                  p->rc = 0x65;
                  p->eStage = 5;
                }
                else {
                  if ((pState->eStage == 0) && (p->zTarget == (char *)0x0)) {
                    rbuCopyPragma(p,"page_size");
                    rbuCopyPragma(p,"auto_vacuum");
                    if (p->rc != 0) break;
                  }
                  iVar2 = sqlite3_exec(db,"BEGIN IMMEDIATE",(sqlite3_callback)0x0,(void *)0x0,
                                       pzErrMsg);
                  p->rc = iVar2;
                  if (iVar2 == 0) {
                    iVar2 = sqlite3_file_control(db,"main",0x19,(void *)0x0);
                    if (iVar2 == 0) {
                      iVar2 = sqlite3_exec(db,"PRAGMA journal_mode=off",(sqlite3_callback)0x0,
                                           (void *)0x0,pzErrMsg);
                      p->rc = iVar2;
                    }
                    else {
                      iVar2 = p->rc;
                    }
                    if ((iVar2 == 0) && (pState->zTbl != (char *)0x0)) {
                      iVar2 = 0;
                      while (iVar2 == 0) {
                        pcVar7 = (p->objiter).zTbl;
                        if (pcVar7 == (char *)0x0) {
                          pcVar7 = sqlite3_mprintf("rbu_state mismatch error");
                          *pzErrMsg = pcVar7;
                          iVar2 = 1;
                          break;
                        }
                        if (((p->objiter).bCleanup == 0) &&
                           (iVar2 = rbuStrCompare((p->objiter).zIdx,pState->zIdx), iVar2 == 0)) {
                          z2 = pState->zDataTbl;
                          if (z2 == (char *)0x0) {
                            z2 = pState->zTbl;
                          }
                          else {
                            pcVar7 = (p->objiter).zDataTbl;
                          }
                          iVar2 = rbuStrCompare(pcVar7,z2);
                          if (iVar2 == 0) {
                            iVar2 = pState->nRow;
                            p->nStep = iVar2;
                            iVar2 = rbuObjIterPrepareAll(p,pIter_00,iVar2);
                            break;
                          }
                        }
                        iVar2 = rbuObjIterNext(p,pIter_00);
                      }
                      p->rc = iVar2;
                    }
                  }
                }
              }
            }
            break;
          case 2:
            break;
          default:
            p->rc = 0xb;
            break;
          case 4:
            rbuSetupCheckpoint(p,pState);
            break;
          case 5:
            p->rc = 0x65;
          }
        }
      }
      goto switchD_0012c27c_caseD_2;
    }
  }
  pState = (RbuState *)0x0;
switchD_0012c27c_caseD_2:
  rbuFreeState(pState);
  return p;
}

Assistant:

static sqlite3rbu *openRbuHandle(
  const char *zTarget, 
  const char *zRbu,
  const char *zState
){
  sqlite3rbu *p;
  size_t nTarget = zTarget ? strlen(zTarget) : 0;
  size_t nRbu = strlen(zRbu);
  size_t nByte = sizeof(sqlite3rbu) + nTarget+1 + nRbu+1;

  p = (sqlite3rbu*)sqlite3_malloc64(nByte);
  if( p ){
    RbuState *pState = 0;

    /* Create the custom VFS. */
    memset(p, 0, sizeof(sqlite3rbu));
    rbuCreateVfs(p);

    /* Open the target, RBU and state databases */
    if( p->rc==SQLITE_OK ){
      char *pCsr = (char*)&p[1];
      int bRetry = 0;
      if( zTarget ){
        p->zTarget = pCsr;
        memcpy(p->zTarget, zTarget, nTarget+1);
        pCsr += nTarget+1;
      }
      p->zRbu = pCsr;
      memcpy(p->zRbu, zRbu, nRbu+1);
      pCsr += nRbu+1;
      if( zState ){
        p->zState = rbuMPrintf(p, "%s", zState);
      }

      /* If the first attempt to open the database file fails and the bRetry
      ** flag it set, this means that the db was not opened because it seemed
      ** to be a wal-mode db. But, this may have happened due to an earlier
      ** RBU vacuum operation leaving an old wal file in the directory.
      ** If this is the case, it will have been checkpointed and deleted
      ** when the handle was closed and a second attempt to open the 
      ** database may succeed.  */
      rbuOpenDatabase(p, &bRetry);
      if( bRetry ){
        rbuOpenDatabase(p, 0);
      }
    }

    if( p->rc==SQLITE_OK ){
      pState = rbuLoadState(p);
      assert( pState || p->rc!=SQLITE_OK );
      if( p->rc==SQLITE_OK ){

        if( pState->eStage==0 ){ 
          rbuDeleteOalFile(p);
          rbuInitPhaseOneSteps(p);
          p->eStage = RBU_STAGE_OAL;
        }else{
          p->eStage = pState->eStage;
          p->nPhaseOneStep = pState->nPhaseOneStep;
        }
        p->nProgress = pState->nProgress;
        p->iOalSz = pState->iOalSz;
      }
    }
    assert( p->rc!=SQLITE_OK || p->eStage!=0 );

    if( p->rc==SQLITE_OK && p->pTargetFd->pWalFd ){
      if( p->eStage==RBU_STAGE_OAL ){
        p->rc = SQLITE_ERROR;
        p->zErrmsg = sqlite3_mprintf("cannot update wal mode database");
      }else if( p->eStage==RBU_STAGE_MOVE ){
        p->eStage = RBU_STAGE_CKPT;
        p->nStep = 0;
      }
    }

    if( p->rc==SQLITE_OK 
     && (p->eStage==RBU_STAGE_OAL || p->eStage==RBU_STAGE_MOVE)
     && pState->eStage!=0
    ){
      rbu_file *pFd = (rbuIsVacuum(p) ? p->pRbuFd : p->pTargetFd);
      if( pFd->iCookie!=pState->iCookie ){   
        /* At this point (pTargetFd->iCookie) contains the value of the
        ** change-counter cookie (the thing that gets incremented when a 
        ** transaction is committed in rollback mode) currently stored on 
        ** page 1 of the database file. */
        p->rc = SQLITE_BUSY;
        p->zErrmsg = sqlite3_mprintf("database modified during rbu %s",
            (rbuIsVacuum(p) ? "vacuum" : "update")
        );
      }
    }

    if( p->rc==SQLITE_OK ){
      if( p->eStage==RBU_STAGE_OAL ){
        sqlite3 *db = p->dbMain;
        p->rc = sqlite3_exec(p->dbRbu, "BEGIN", 0, 0, &p->zErrmsg);

        /* Point the object iterator at the first object */
        if( p->rc==SQLITE_OK ){
          p->rc = rbuObjIterFirst(p, &p->objiter);
        }

        /* If the RBU database contains no data_xxx tables, declare the RBU
        ** update finished.  */
        if( p->rc==SQLITE_OK && p->objiter.zTbl==0 ){
          p->rc = SQLITE_DONE;
          p->eStage = RBU_STAGE_DONE;
        }else{
          if( p->rc==SQLITE_OK && pState->eStage==0 && rbuIsVacuum(p) ){
            rbuCopyPragma(p, "page_size");
            rbuCopyPragma(p, "auto_vacuum");
          }

          /* Open transactions both databases. The *-oal file is opened or
          ** created at this point. */
          if( p->rc==SQLITE_OK ){
            p->rc = sqlite3_exec(db, "BEGIN IMMEDIATE", 0, 0, &p->zErrmsg);
          }

          /* Check if the main database is a zipvfs db. If it is, set the upper
          ** level pager to use "journal_mode=off". This prevents it from 
          ** generating a large journal using a temp file.  */
          if( p->rc==SQLITE_OK ){
            int frc = sqlite3_file_control(db, "main", SQLITE_FCNTL_ZIPVFS, 0);
            if( frc==SQLITE_OK ){
              p->rc = sqlite3_exec(
                db, "PRAGMA journal_mode=off",0,0,&p->zErrmsg);
            }
          }

          if( p->rc==SQLITE_OK ){
            rbuSetupOal(p, pState);
          }
        }
      }else if( p->eStage==RBU_STAGE_MOVE ){
        /* no-op */
      }else if( p->eStage==RBU_STAGE_CKPT ){
        rbuSetupCheckpoint(p, pState);
      }else if( p->eStage==RBU_STAGE_DONE ){
        p->rc = SQLITE_DONE;
      }else{
        p->rc = SQLITE_CORRUPT;
      }
    }

    rbuFreeState(pState);
  }

  return p;
}